

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int pack_particle_slice(field3d<cellp> *cp,int left,int width,
                       vector<int,_std::allocator<int>_> *particle_numbers,
                       vector<particle,_std::allocator<particle>_> *particles)

{
  int k;
  long lVar1;
  long lVar2;
  int j;
  long lVar3;
  long lVar4;
  size_t p_index;
  size_t pn_index;
  size_t local_50;
  long local_48;
  vector<particle,_std::allocator<particle>_> *local_40;
  size_t local_38;
  
  local_38 = 0;
  local_50 = 0;
  local_48 = (long)(width + left);
  local_40 = particles;
  for (lVar2 = (long)left; lVar2 < local_48; lVar2 = lVar2 + 1) {
    for (lVar3 = 0; lVar3 < ny_global; lVar3 = lVar3 + 1) {
      lVar4 = 0;
      for (lVar1 = 0; lVar1 < nz_global; lVar1 = lVar1 + 1) {
        pack_cell((cellp *)((long)&((cp->p)._M_t.
                                    super___uniq_ptr_impl<cellp_**,_std::default_delete<cellp_**[]>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_cellp_***,_std::default_delete<cellp_**[]>_>
                                    .super__Head_base<0UL,_cellp_***,_false>._M_head_impl[lVar2]
                                    [lVar3]->pl).head + lVar4),particle_numbers,&local_38,local_40,
                  &local_50);
        lVar4 = lVar4 + 0x10;
      }
    }
  }
  return (int)local_50;
}

Assistant:

int pack_particle_slice(field3d<cellp> & cp, int left, int width, vector<int> & particle_numbers, vector<particle> & particles) {
    size_t pn_index = 0;
    size_t p_index = 0;

    for (int i=left; i<left+width; i++) {
        for (int j=0;j<ny_global;j++) {
            for (int k=0;k<nz_global;k++) {
                pack_cell(cp[i][j][k], particle_numbers, pn_index, particles, p_index);
            }
        }
    }

    return static_cast<int>(p_index);
}